

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

void phyr::sortSampleSpace(double *lambda,double *v,int n)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> data;
  _Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_58;
  pair<double,_double> local_40;
  
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             &local_58,(long)n,(allocator_type *)&local_40);
  uVar2 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    local_40.first = lambda[uVar2];
    local_40.second = v[uVar2];
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<std::pair<double,double>>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               &local_58,&local_40);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<double,double>*,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_58._M_impl.super__Vector_impl_data._M_start,
             local_58._M_impl.super__Vector_impl_data._M_finish);
  for (lVar1 = 0; uVar3 * 8 != lVar1; lVar1 = lVar1 + 8) {
    *(undefined8 *)((long)lambda + lVar1) =
         *(undefined8 *)
          ((long)&(local_58._M_impl.super__Vector_impl_data._M_start)->first + lVar1 * 2);
    *(undefined8 *)((long)v + lVar1) =
         *(undefined8 *)
          ((long)&(local_58._M_impl.super__Vector_impl_data._M_start)->second + lVar1 * 2);
  }
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&local_58);
  return;
}

Assistant:

void sortSampleSpace(Real* lambda, Real* v, int n) {
    std::vector<std::pair<Real, Real>> data(n);

    // Populate data
    for (int i = 0; i < n; i++)
        data.push_back(std::make_pair(lambda[i], v[i]));
    std::sort(data.begin(), data.end());

    // Restore sorted data
    for (int i = 0; i < n; i++) {
        lambda[i] = data[i].first;
        v[i] = data[i].second;
    }
}